

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

void mat_tpose_vec(csc *A,c_float *x,c_float *y,c_int plus_eq,c_int skip_diag)

{
  double local_50;
  double local_48;
  c_int k;
  c_int j;
  c_int i;
  c_int skip_diag_local;
  c_int plus_eq_local;
  c_float *y_local;
  c_float *x_local;
  csc *A_local;
  
  if (plus_eq == 0) {
    for (i = 0; i < A->n; i = i + 1) {
      y[i] = 0.0;
    }
  }
  if (A->p[A->n] != 0) {
    if (plus_eq == -1) {
      if (skip_diag == 0) {
        for (j = 0; j < A->n; j = j + 1) {
          for (k = A->p[j]; k < A->p[j + 1]; k = k + 1) {
            y[j] = -A->x[k] * x[A->i[k]] + y[j];
          }
        }
      }
      else {
        for (j = 0; j < A->n; j = j + 1) {
          for (k = A->p[j]; k < A->p[j + 1]; k = k + 1) {
            if (A->i[k] == j) {
              local_48 = 0.0;
            }
            else {
              local_48 = A->x[k] * x[A->i[k]];
            }
            y[j] = y[j] - local_48;
          }
        }
      }
    }
    else if (skip_diag == 0) {
      for (j = 0; j < A->n; j = j + 1) {
        for (k = A->p[j]; k < A->p[j + 1]; k = k + 1) {
          y[j] = A->x[k] * x[A->i[k]] + y[j];
        }
      }
    }
    else {
      for (j = 0; j < A->n; j = j + 1) {
        for (k = A->p[j]; k < A->p[j + 1]; k = k + 1) {
          if (A->i[k] == j) {
            local_50 = 0.0;
          }
          else {
            local_50 = A->x[k] * x[A->i[k]];
          }
          y[j] = local_50 + y[j];
        }
      }
    }
  }
  return;
}

Assistant:

void mat_tpose_vec(const csc *A, const c_float *x, c_float *y,
                   c_int plus_eq, c_int skip_diag) {
  c_int i, j, k;

  if (!plus_eq) {
    // y = 0
    for (i = 0; i < A->n; i++) {
      y[i] = 0;
    }
  }

  // if A is empty
  if (A->p[A->n] == 0) {
    return;
  }

  if (plus_eq == -1) {
    // y -=  A*x
    if (skip_diag) {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          i     = A->i[k];
          y[j] -= i == j ? 0 : A->x[k] * x[i];
        }
      }
    } else {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          y[j] -= A->x[k] * x[A->i[k]];
        }
      }
    }
  } else {
    // y +=  A*x
    if (skip_diag) {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          i     = A->i[k];
          y[j] += i == j ? 0 : A->x[k] * x[i];
        }
      }
    } else {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          y[j] += A->x[k] * x[A->i[k]];
        }
      }
    }
  }
}